

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O2

void __thiscall Assimp::ColladaExporter::~ColladaExporter(ColladaExporter *this)

{
  aiScene *this_00;
  
  this->_vptr_ColladaExporter = (_func_int **)&PTR__ColladaExporter_0071bd20;
  if (this->mSceneOwned == true) {
    this_00 = this->mScene;
    if (this_00 != (aiScene *)0x0) {
      aiScene::~aiScene(this_00);
    }
    operator_delete(this_00);
  }
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->textures)._M_t);
  std::vector<Assimp::ColladaExporter::Material,_std::allocator<Assimp::ColladaExporter::Material>_>
  ::~vector(&this->materials);
  std::__cxx11::string::~string((string *)&this->endstr);
  std::__cxx11::string::~string((string *)&this->startstr);
  std::__cxx11::string::~string((string *)&this->mFile);
  std::__cxx11::string::~string((string *)&this->mPath);
  std::__cxx11::stringstream::~stringstream((stringstream *)&this->mOutput);
  std::__cxx11::string::~string((string *)&this->mFoundSkeletonRootNodeID);
  return;
}

Assistant:

ColladaExporter::~ColladaExporter() {
    if ( mSceneOwned ) {
        delete mScene;
    }
}